

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockchain.cpp
# Opt level: O0

RPCHelpMan * scantxoutset(void)

{
  long lVar1;
  initializer_list<RPCArg> __l;
  initializer_list<RPCResult> __l_00;
  initializer_list<RPCResult> __l_01;
  initializer_list<RPCResult> __l_02;
  initializer_list<RPCResult> results;
  RPCHelpMan *in_RDI;
  undefined1 *puVar2;
  long in_FS_OFFSET;
  allocator<RPCResult> *in_stack_ffffffffffffe428;
  RPCArg *this;
  anon_class_1_0_00000001 *in_stack_ffffffffffffe430;
  function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *in_stack_ffffffffffffe438;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe440;
  RPCResults *in_stack_ffffffffffffe450;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe458;
  RPCArg *in_stack_ffffffffffffe460;
  RPCArg *in_stack_ffffffffffffe468;
  iterator in_stack_ffffffffffffe470;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe478;
  undefined7 in_stack_ffffffffffffe488;
  undefined1 in_stack_ffffffffffffe48f;
  string *in_stack_ffffffffffffe490;
  string *in_stack_ffffffffffffe498;
  undefined4 in_stack_ffffffffffffe4a0;
  Type in_stack_ffffffffffffe4a4;
  undefined4 in_stack_ffffffffffffe4a8;
  Type in_stack_ffffffffffffe4ac;
  RPCResult *in_stack_ffffffffffffe4b0;
  undefined1 *local_1af0;
  undefined1 *local_1ad8;
  undefined1 *local_1ac0;
  undefined1 *local_1aa8;
  RPCExamples *in_stack_ffffffffffffe570;
  vector<RPCArg,_std::allocator<RPCArg>_> *args;
  string *description;
  string *name;
  RPCHelpMan *this_00;
  RPCMethodImpl *fun;
  undefined1 local_1768 [37];
  undefined1 local_1743;
  undefined1 local_1742;
  undefined1 local_1741;
  undefined1 local_1740 [2];
  allocator<char> local_173e;
  allocator<char> local_173d;
  allocator<char> local_173c;
  allocator<char> local_173b;
  allocator<char> local_173a [2];
  pointer local_1738;
  undefined1 auStack_1730 [21];
  allocator<char> local_171b [33];
  allocator<char> local_16fa;
  allocator<char> local_16f9 [9];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_16f0;
  allocator<char> local_16da;
  allocator<char> local_16d9 [9];
  pointer pRStack_16d0;
  _Alloc_hider local_16c8;
  allocator<char> local_16ba;
  allocator<char> local_16b9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_16b8;
  size_type local_16a8;
  allocator<char> local_169a;
  allocator<char> local_1699 [9];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_1690;
  undefined1 local_1679 [17];
  undefined8 local_1668;
  allocator<char> local_165a;
  allocator<char> local_1659;
  undefined8 local_1658;
  undefined8 uStack_1650;
  undefined8 local_1648;
  allocator<char> local_163a;
  allocator<char> local_1639;
  undefined8 local_1638;
  undefined8 uStack_1630;
  undefined8 local_1628;
  allocator<char> local_161a;
  allocator<char> local_1619;
  undefined8 local_1618;
  undefined8 uStack_1610;
  undefined8 local_1608;
  allocator<char> local_15fa;
  allocator<char> local_15f9 [31];
  allocator<char> local_15da;
  allocator<char> local_15d9 [31];
  allocator<char> local_15ba;
  allocator<char> local_15b9;
  undefined8 local_15b8;
  undefined8 uStack_15b0;
  undefined8 local_15a8;
  allocator<char> local_159a;
  allocator<char> local_1599;
  undefined8 local_1598;
  undefined8 uStack_1590;
  undefined8 local_1588;
  allocator<char> local_157a;
  allocator<char> local_1579;
  undefined8 local_1578;
  undefined8 uStack_1570;
  undefined8 local_1568;
  allocator<char> local_155a;
  allocator<char> local_1559;
  undefined8 local_1558;
  undefined8 uStack_1550;
  undefined8 local_1548;
  allocator<char> local_153a;
  allocator<char> local_1539 [30];
  allocator<char> local_151b;
  allocator<char> local_151a;
  allocator<char> local_1519 [62];
  allocator<char> local_14db;
  allocator<char> local_14da;
  allocator<char> local_14d9 [1241];
  undefined8 local_1000;
  undefined1 local_ef8 [1224];
  undefined1 local_a30 [64];
  undefined1 local_9f0 [136];
  undefined1 local_968 [320];
  undefined1 local_828 [816];
  undefined1 local_4f8 [96];
  undefined1 local_498 [544];
  undefined1 local_278 [528];
  undefined1 local_68 [64];
  string EXAMPLE_DESCRIPTOR_RAW;
  
  local_1000 = 0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe478,(char *)in_stack_ffffffffffffe470,
             (allocator<char> *)in_stack_ffffffffffffe468);
  std::allocator<char>::~allocator(local_14d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe478,(char *)in_stack_ffffffffffffe470,
             (allocator<char> *)in_stack_ffffffffffffe468);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe478,(char *)in_stack_ffffffffffffe470,
             (allocator<char> *)in_stack_ffffffffffffe468);
  RPCArg::RPCArg(in_stack_ffffffffffffe468,in_stack_ffffffffffffe460);
  RPCArg::RPCArg(in_stack_ffffffffffffe468,in_stack_ffffffffffffe460);
  std::allocator<RPCArg>::allocator((allocator<RPCArg> *)in_stack_ffffffffffffe428);
  __l._M_len = (size_type)in_stack_ffffffffffffe478;
  __l._M_array = in_stack_ffffffffffffe470;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffe468,__l,
             (allocator_type *)in_stack_ffffffffffffe460);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe478,(char *)in_stack_ffffffffffffe470,
             (allocator<char> *)in_stack_ffffffffffffe468);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe478,(char *)in_stack_ffffffffffffe470,
             (allocator<char> *)in_stack_ffffffffffffe468);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe478,(char *)in_stack_ffffffffffffe470,
             (allocator<char> *)in_stack_ffffffffffffe468);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe478,(char *)in_stack_ffffffffffffe470,
             (allocator<char> *)in_stack_ffffffffffffe468);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe478,(char *)in_stack_ffffffffffffe470,
             (allocator<char> *)in_stack_ffffffffffffe468);
  local_1558 = 0;
  uStack_1550 = 0;
  local_1548 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe428);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe4b0,in_stack_ffffffffffffe4ac,
             (string *)CONCAT44(in_stack_ffffffffffffe4a4,in_stack_ffffffffffffe4a0),
             in_stack_ffffffffffffe498,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe490,
             (bool)in_stack_ffffffffffffe48f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe478,(char *)in_stack_ffffffffffffe470,
             (allocator<char> *)in_stack_ffffffffffffe468);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe478,(char *)in_stack_ffffffffffffe470,
             (allocator<char> *)in_stack_ffffffffffffe468);
  local_1578 = 0;
  uStack_1570 = 0;
  local_1568 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe428);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe4b0,in_stack_ffffffffffffe4ac,
             (string *)CONCAT44(in_stack_ffffffffffffe4a4,in_stack_ffffffffffffe4a0),
             in_stack_ffffffffffffe498,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe490,
             (bool)in_stack_ffffffffffffe48f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe478,(char *)in_stack_ffffffffffffe470,
             (allocator<char> *)in_stack_ffffffffffffe468);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe478,(char *)in_stack_ffffffffffffe470,
             (allocator<char> *)in_stack_ffffffffffffe468);
  local_1598 = 0;
  uStack_1590 = 0;
  local_1588 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe428);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe4b0,in_stack_ffffffffffffe4ac,
             (string *)CONCAT44(in_stack_ffffffffffffe4a4,in_stack_ffffffffffffe4a0),
             in_stack_ffffffffffffe498,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe490,
             (bool)in_stack_ffffffffffffe48f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe478,(char *)in_stack_ffffffffffffe470,
             (allocator<char> *)in_stack_ffffffffffffe468);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe478,(char *)in_stack_ffffffffffffe470,
             (allocator<char> *)in_stack_ffffffffffffe468);
  local_15b8 = 0;
  uStack_15b0 = 0;
  local_15a8 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe428);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe4b0,in_stack_ffffffffffffe4ac,
             (string *)CONCAT44(in_stack_ffffffffffffe4a4,in_stack_ffffffffffffe4a0),
             in_stack_ffffffffffffe498,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe490,
             (bool)in_stack_ffffffffffffe48f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe478,(char *)in_stack_ffffffffffffe470,
             (allocator<char> *)in_stack_ffffffffffffe468);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe478,(char *)in_stack_ffffffffffffe470,
             (allocator<char> *)in_stack_ffffffffffffe468);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe478,(char *)in_stack_ffffffffffffe470,
             (allocator<char> *)in_stack_ffffffffffffe468);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe478,(char *)in_stack_ffffffffffffe470,
             (allocator<char> *)in_stack_ffffffffffffe468);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe478,(char *)in_stack_ffffffffffffe470,
             (allocator<char> *)in_stack_ffffffffffffe468);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe478,(char *)in_stack_ffffffffffffe470,
             (allocator<char> *)in_stack_ffffffffffffe468);
  local_1618 = 0;
  uStack_1610 = 0;
  local_1608 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe428);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe4b0,in_stack_ffffffffffffe4ac,
             (string *)CONCAT44(in_stack_ffffffffffffe4a4,in_stack_ffffffffffffe4a0),
             in_stack_ffffffffffffe498,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe490,
             (bool)in_stack_ffffffffffffe48f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe478,(char *)in_stack_ffffffffffffe470,
             (allocator<char> *)in_stack_ffffffffffffe468);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe478,(char *)in_stack_ffffffffffffe470,
             (allocator<char> *)in_stack_ffffffffffffe468);
  local_1638 = 0;
  uStack_1630 = 0;
  local_1628 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe428);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe4b0,in_stack_ffffffffffffe4ac,
             (string *)CONCAT44(in_stack_ffffffffffffe4a4,in_stack_ffffffffffffe4a0),
             in_stack_ffffffffffffe498,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe490,
             (bool)in_stack_ffffffffffffe48f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe478,(char *)in_stack_ffffffffffffe470,
             (allocator<char> *)in_stack_ffffffffffffe468);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe478,(char *)in_stack_ffffffffffffe470,
             (allocator<char> *)in_stack_ffffffffffffe468);
  local_1658 = 0;
  uStack_1650 = 0;
  local_1648 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe428);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe4b0,in_stack_ffffffffffffe4ac,
             (string *)CONCAT44(in_stack_ffffffffffffe4a4,in_stack_ffffffffffffe4a0),
             in_stack_ffffffffffffe498,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe490,
             (bool)in_stack_ffffffffffffe48f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe478,(char *)in_stack_ffffffffffffe470,
             (allocator<char> *)in_stack_ffffffffffffe468);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe478,(char *)in_stack_ffffffffffffe470,
             (allocator<char> *)in_stack_ffffffffffffe468);
  local_1679._1_8_ = 0;
  local_1679._9_8_ = (pointer)0x0;
  local_1668 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe428);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe4b0,in_stack_ffffffffffffe4ac,
             (string *)CONCAT44(in_stack_ffffffffffffe4a4,in_stack_ffffffffffffe4a0),
             in_stack_ffffffffffffe498,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe490,
             (bool)in_stack_ffffffffffffe48f);
  fun = (RPCMethodImpl *)local_1679;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe478,(char *)in_stack_ffffffffffffe470,
             (allocator<char> *)in_stack_ffffffffffffe468);
  std::operator+((char *)in_stack_ffffffffffffe478,&in_stack_ffffffffffffe470->m_names);
  std::operator+(in_stack_ffffffffffffe440,(char *)in_stack_ffffffffffffe438);
  local_1699[1] = (allocator<char>)0x0;
  local_1699[2] = (allocator<char>)0x0;
  local_1699[3] = (allocator<char>)0x0;
  local_1699[4] = (allocator<char>)0x0;
  local_1699[5] = (allocator<char>)0x0;
  local_1699[6] = (allocator<char>)0x0;
  local_1699[7] = (allocator<char>)0x0;
  local_1699[8] = (allocator<char>)0x0;
  aStack_1690._M_allocated_capacity = 0;
  aStack_1690._8_8_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe428);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe4b0,in_stack_ffffffffffffe4ac,
             (string *)CONCAT44(in_stack_ffffffffffffe4a4,in_stack_ffffffffffffe4a0),
             in_stack_ffffffffffffe498,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe490,
             (bool)in_stack_ffffffffffffe48f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe478,(char *)in_stack_ffffffffffffe470,
             (allocator<char> *)in_stack_ffffffffffffe468);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe478,(char *)in_stack_ffffffffffffe470,
             (allocator<char> *)in_stack_ffffffffffffe468);
  local_16b8._M_allocated_capacity = 0;
  local_16b8._8_8_ = (pointer)0x0;
  local_16a8 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe428);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe4b0,in_stack_ffffffffffffe4ac,
             (string *)CONCAT44(in_stack_ffffffffffffe4a4,in_stack_ffffffffffffe4a0),
             in_stack_ffffffffffffe498,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe490,
             (bool)in_stack_ffffffffffffe48f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe478,(char *)in_stack_ffffffffffffe470,
             (allocator<char> *)in_stack_ffffffffffffe468);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe478,(char *)in_stack_ffffffffffffe470,
             (allocator<char> *)in_stack_ffffffffffffe468);
  local_16d9._1_8_ = (pointer)0x0;
  pRStack_16d0 = (pointer)0x0;
  local_16c8._M_p = (pointer)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe428);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe4b0,in_stack_ffffffffffffe4ac,
             (string *)CONCAT44(in_stack_ffffffffffffe4a4,in_stack_ffffffffffffe4a0),
             in_stack_ffffffffffffe498,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe490,
             (bool)in_stack_ffffffffffffe48f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe478,(char *)in_stack_ffffffffffffe470,
             (allocator<char> *)in_stack_ffffffffffffe468);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe478,(char *)in_stack_ffffffffffffe470,
             (allocator<char> *)in_stack_ffffffffffffe468);
  local_16f9[1] = (allocator<char>)0x0;
  local_16f9[2] = (allocator<char>)0x0;
  local_16f9[3] = (allocator<char>)0x0;
  local_16f9[4] = (allocator<char>)0x0;
  local_16f9[5] = (allocator<char>)0x0;
  local_16f9[6] = (allocator<char>)0x0;
  local_16f9[7] = (allocator<char>)0x0;
  local_16f9[8] = (allocator<char>)0x0;
  aStack_16f0._M_allocated_capacity = 0;
  aStack_16f0._8_8_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe428);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe4b0,in_stack_ffffffffffffe4ac,
             (string *)CONCAT44(in_stack_ffffffffffffe4a4,in_stack_ffffffffffffe4a0),
             in_stack_ffffffffffffe498,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe490,
             (bool)in_stack_ffffffffffffe48f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe478,(char *)in_stack_ffffffffffffe470,
             (allocator<char> *)in_stack_ffffffffffffe468);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe478,(char *)in_stack_ffffffffffffe470,
             (allocator<char> *)in_stack_ffffffffffffe468);
  local_171b[3] = (allocator<char>)0x0;
  local_171b[4] = (allocator<char>)0x0;
  local_171b[5] = (allocator<char>)0x0;
  local_171b[6] = (allocator<char>)0x0;
  local_171b[7] = (allocator<char>)0x0;
  local_171b[8] = (allocator<char>)0x0;
  local_171b[9] = (allocator<char>)0x0;
  local_171b[10] = (allocator<char>)0x0;
  local_171b._11_8_ = (_Manager_type)0x0;
  local_171b._19_8_ = (_Invoker_type)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe428);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe4b0,in_stack_ffffffffffffe4ac,
             (string *)CONCAT44(in_stack_ffffffffffffe4a4,in_stack_ffffffffffffe4a0),
             in_stack_ffffffffffffe498,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe490,
             (bool)in_stack_ffffffffffffe48f);
  std::allocator<RPCResult>::allocator(in_stack_ffffffffffffe428);
  __l_00._M_len = (size_type)in_stack_ffffffffffffe478;
  __l_00._M_array = (iterator)in_stack_ffffffffffffe470;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe468,__l_00,
             (allocator_type *)in_stack_ffffffffffffe460);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe4b0,in_stack_ffffffffffffe4ac,
             (string *)CONCAT44(in_stack_ffffffffffffe4a4,in_stack_ffffffffffffe4a0),
             in_stack_ffffffffffffe498,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe490,
             (bool)in_stack_ffffffffffffe48f);
  std::allocator<RPCResult>::allocator(in_stack_ffffffffffffe428);
  __l_01._M_len = (size_type)in_stack_ffffffffffffe478;
  __l_01._M_array = (iterator)in_stack_ffffffffffffe470;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe468,__l_01,
             (allocator_type *)in_stack_ffffffffffffe460);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe4b0,in_stack_ffffffffffffe4ac,
             (string *)CONCAT44(in_stack_ffffffffffffe4a4,in_stack_ffffffffffffe4a0),
             in_stack_ffffffffffffe498,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe490,
             (bool)in_stack_ffffffffffffe48f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe478,(char *)in_stack_ffffffffffffe470,
             (allocator<char> *)in_stack_ffffffffffffe468);
  std::operator+((char *)in_stack_ffffffffffffe478,&in_stack_ffffffffffffe470->m_names);
  local_1738 = (pointer)0x0;
  auStack_1730._0_8_ = 0;
  auStack_1730._8_8_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe428);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe4b0,in_stack_ffffffffffffe4ac,
             (string *)CONCAT44(in_stack_ffffffffffffe4a4,in_stack_ffffffffffffe4a0),
             in_stack_ffffffffffffe498,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe490,
             (bool)in_stack_ffffffffffffe48f);
  std::allocator<RPCResult>::allocator(in_stack_ffffffffffffe428);
  __l_02._M_len = (size_type)in_stack_ffffffffffffe478;
  __l_02._M_array = (iterator)in_stack_ffffffffffffe470;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe468,__l_02,
             (allocator_type *)in_stack_ffffffffffffe460);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe4b0,
             (string *)CONCAT44(in_stack_ffffffffffffe4ac,in_stack_ffffffffffffe4a8),
             in_stack_ffffffffffffe4a4,in_stack_ffffffffffffe498,in_stack_ffffffffffffe490,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT17(in_stack_ffffffffffffe48f,in_stack_ffffffffffffe488));
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffe468,(RPCResult *)in_stack_ffffffffffffe460);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffe468,(RPCResult *)in_stack_ffffffffffffe460);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffe468,(RPCResult *)in_stack_ffffffffffffe460);
  results._M_len = (size_type)in_stack_ffffffffffffe478;
  results._M_array = (iterator)in_stack_ffffffffffffe470;
  RPCResults::RPCResults(in_stack_ffffffffffffe450,results);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe478,(char *)in_stack_ffffffffffffe470,
             (allocator<char> *)in_stack_ffffffffffffe468);
  std::operator+((char *)in_stack_ffffffffffffe478,&in_stack_ffffffffffffe470->m_names);
  std::operator+(in_stack_ffffffffffffe440,(char *)in_stack_ffffffffffffe438);
  HelpExampleCli(&in_stack_ffffffffffffe460->m_names,in_stack_ffffffffffffe458);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe478,(char *)in_stack_ffffffffffffe470,
             (allocator<char> *)in_stack_ffffffffffffe468);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe478,(char *)in_stack_ffffffffffffe470,
             (allocator<char> *)in_stack_ffffffffffffe468);
  HelpExampleCli(&in_stack_ffffffffffffe460->m_names,in_stack_ffffffffffffe458);
  std::operator+(&in_stack_ffffffffffffe460->m_names,in_stack_ffffffffffffe458);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe478,(char *)in_stack_ffffffffffffe470,
             (allocator<char> *)in_stack_ffffffffffffe468);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe478,(char *)in_stack_ffffffffffffe470,
             (allocator<char> *)in_stack_ffffffffffffe468);
  HelpExampleCli(&in_stack_ffffffffffffe460->m_names,in_stack_ffffffffffffe458);
  std::operator+(&in_stack_ffffffffffffe460->m_names,in_stack_ffffffffffffe458);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe478,(char *)in_stack_ffffffffffffe470,
             (allocator<char> *)in_stack_ffffffffffffe468);
  std::operator+((char *)in_stack_ffffffffffffe478,&in_stack_ffffffffffffe470->m_names);
  std::operator+(in_stack_ffffffffffffe440,(char *)in_stack_ffffffffffffe438);
  HelpExampleRpc(&in_stack_ffffffffffffe460->m_names,in_stack_ffffffffffffe458);
  std::operator+(&in_stack_ffffffffffffe460->m_names,in_stack_ffffffffffffe458);
  this_00 = (RPCHelpMan *)local_1740;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe478,(char *)in_stack_ffffffffffffe470,
             (allocator<char> *)in_stack_ffffffffffffe468);
  name = (string *)&local_1741;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe478,(char *)in_stack_ffffffffffffe470,
             (allocator<char> *)in_stack_ffffffffffffe468);
  HelpExampleRpc(&in_stack_ffffffffffffe460->m_names,in_stack_ffffffffffffe458);
  std::operator+(&in_stack_ffffffffffffe460->m_names,in_stack_ffffffffffffe458);
  description = (string *)&local_1742;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe478,(char *)in_stack_ffffffffffffe470,
             (allocator<char> *)in_stack_ffffffffffffe468);
  args = (vector<RPCArg,_std::allocator<RPCArg>_> *)&local_1743;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe478,(char *)in_stack_ffffffffffffe470,
             (allocator<char> *)in_stack_ffffffffffffe468);
  HelpExampleRpc(&in_stack_ffffffffffffe460->m_names,in_stack_ffffffffffffe458);
  std::operator+(&in_stack_ffffffffffffe460->m_names,in_stack_ffffffffffffe458);
  RPCExamples::RPCExamples((RPCExamples *)in_stack_ffffffffffffe428,(string *)0x1292d67);
  this = (RPCArg *)local_1768;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<scantxoutset()::__0,void>(in_stack_ffffffffffffe438,in_stack_ffffffffffffe430);
  RPCHelpMan::RPCHelpMan
            (this_00,name,description,args,(RPCResults *)this,in_stack_ffffffffffffe570,fun);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this);
  RPCExamples::~RPCExamples((RPCExamples *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&local_1743);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&local_1742);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&local_1741);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)local_1740);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_1740 + 1));
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_173e);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_173d);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_173c);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_173b);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_173a);
  RPCResults::~RPCResults((RPCResults *)this);
  puVar2 = local_278;
  do {
    puVar2 = puVar2 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this);
  } while (puVar2 != local_498);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe438);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  local_1aa8 = local_4f8;
  do {
    local_1aa8 = local_1aa8 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this);
  } while (local_1aa8 != local_828);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe438);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_171b);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe438);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  local_1ac0 = local_968;
  do {
    local_1ac0 = local_1ac0 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this);
  } while (local_1ac0 != local_9f0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe438);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  local_1ad8 = local_a30;
  do {
    local_1ad8 = local_1ad8 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this);
  } while (local_1ad8 != local_ef8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe438);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_16fa);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_16f9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe438);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_16da);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_16d9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe438);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_16ba);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_16b9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe438);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_169a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_1699);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe438);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)local_1679);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe438);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_165a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1659);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe438);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_163a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1639);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe438);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_161a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1619);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe438);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_15fa);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_15f9);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_15da);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_15d9);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_15ba);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_15b9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe438);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_159a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1599);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe438);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_157a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1579);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe438);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_155a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1559);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe438);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_153a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_1539);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_151b);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_151a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_1519);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffe438);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this);
  local_1af0 = local_68;
  do {
    local_1af0 = local_1af0 + -0x108;
    RPCArg::~RPCArg(this);
  } while (local_1af0 != local_278);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_14db);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_14da);
  std::__cxx11::string::~string(&this->m_names);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan scantxoutset()
{
    // raw() descriptor corresponding to mainnet address 12cbQLTFMXRnSzktFkuoG3eHoMeFtpTu3S
    const std::string EXAMPLE_DESCRIPTOR_RAW = "raw(76a91411b366edfc0a8b66feebae5c2e25a7b6a5d1cf3188ac)#fm24fxxy";

    return RPCHelpMan{"scantxoutset",
        "\nScans the unspent transaction output set for entries that match certain output descriptors.\n"
        "Examples of output descriptors are:\n"
        "    addr(<address>)                      Outputs whose output script corresponds to the specified address (does not include P2PK)\n"
        "    raw(<hex script>)                    Outputs whose output script equals the specified hex-encoded bytes\n"
        "    combo(<pubkey>)                      P2PK, P2PKH, P2WPKH, and P2SH-P2WPKH outputs for the given pubkey\n"
        "    pkh(<pubkey>)                        P2PKH outputs for the given pubkey\n"
        "    sh(multi(<n>,<pubkey>,<pubkey>,...)) P2SH-multisig outputs for the given threshold and pubkeys\n"
        "    tr(<pubkey>)                         P2TR\n"
        "    tr(<pubkey>,{pk(<pubkey>)})          P2TR with single fallback pubkey in tapscript\n"
        "    rawtr(<pubkey>)                      P2TR with the specified key as output key rather than inner\n"
        "    wsh(and_v(v:pk(<pubkey>),after(2)))  P2WSH miniscript with mandatory pubkey and a timelock\n"
        "\nIn the above, <pubkey> either refers to a fixed public key in hexadecimal notation, or to an xpub/xprv optionally followed by one\n"
        "or more path elements separated by \"/\", and optionally ending in \"/*\" (unhardened), or \"/*'\" or \"/*h\" (hardened) to specify all\n"
        "unhardened or hardened child keys.\n"
        "In the latter case, a range needs to be specified by below if different from 1000.\n"
        "For more information on output descriptors, see the documentation in the doc/descriptors.md file.\n",
        {
            scan_action_arg_desc,
            scan_objects_arg_desc,
        },
        {
            RPCResult{"when action=='start'; only returns after scan completes", RPCResult::Type::OBJ, "", "", {
                {RPCResult::Type::BOOL, "success", "Whether the scan was completed"},
                {RPCResult::Type::NUM, "txouts", "The number of unspent transaction outputs scanned"},
                {RPCResult::Type::NUM, "height", "The block height at which the scan was done"},
                {RPCResult::Type::STR_HEX, "bestblock", "The hash of the block at the tip of the chain"},
                {RPCResult::Type::ARR, "unspents", "",
                {
                    {RPCResult::Type::OBJ, "", "",
                    {
                        {RPCResult::Type::STR_HEX, "txid", "The transaction id"},
                        {RPCResult::Type::NUM, "vout", "The vout value"},
                        {RPCResult::Type::STR_HEX, "scriptPubKey", "The output script"},
                        {RPCResult::Type::STR, "desc", "A specialized descriptor for the matched output script"},
                        {RPCResult::Type::STR_AMOUNT, "amount", "The total amount in " + CURRENCY_UNIT + " of the unspent output"},
                        {RPCResult::Type::BOOL, "coinbase", "Whether this is a coinbase output"},
                        {RPCResult::Type::NUM, "height", "Height of the unspent transaction output"},
                        {RPCResult::Type::STR_HEX, "blockhash", "Blockhash of the unspent transaction output"},
                        {RPCResult::Type::NUM, "confirmations", "Number of confirmations of the unspent transaction output when the scan was done"},
                    }},
                }},
                {RPCResult::Type::STR_AMOUNT, "total_amount", "The total amount of all found unspent outputs in " + CURRENCY_UNIT},
            }},
            scan_result_abort,
            scan_result_status_some,
            scan_result_status_none,
        },
        RPCExamples{
            HelpExampleCli("scantxoutset", "start \'[\"" + EXAMPLE_DESCRIPTOR_RAW + "\"]\'") +
            HelpExampleCli("scantxoutset", "status") +
            HelpExampleCli("scantxoutset", "abort") +
            HelpExampleRpc("scantxoutset", "\"start\", [\"" + EXAMPLE_DESCRIPTOR_RAW + "\"]") +
            HelpExampleRpc("scantxoutset", "\"status\"") +
            HelpExampleRpc("scantxoutset", "\"abort\"")
        },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    UniValue result(UniValue::VOBJ);
    const auto action{self.Arg<std::string>("action")};
    if (action == "status") {
        CoinsViewScanReserver reserver;
        if (reserver.reserve()) {
            // no scan in progress
            return UniValue::VNULL;
        }
        result.pushKV("progress", g_scan_progress.load());
        return result;
    } else if (action == "abort") {
        CoinsViewScanReserver reserver;
        if (reserver.reserve()) {
            // reserve was possible which means no scan was running
            return false;
        }
        // set the abort flag
        g_should_abort_scan = true;
        return true;
    } else if (action == "start") {
        CoinsViewScanReserver reserver;
        if (!reserver.reserve()) {
            throw JSONRPCError(RPC_INVALID_PARAMETER, "Scan already in progress, use action \"abort\" or \"status\"");
        }

        if (request.params.size() < 2) {
            throw JSONRPCError(RPC_MISC_ERROR, "scanobjects argument is required for the start action");
        }

        std::set<CScript> needles;
        std::map<CScript, std::string> descriptors;
        CAmount total_in = 0;

        // loop through the scan objects
        for (const UniValue& scanobject : request.params[1].get_array().getValues()) {
            FlatSigningProvider provider;
            auto scripts = EvalDescriptorStringOrObject(scanobject, provider);
            for (CScript& script : scripts) {
                std::string inferred = InferDescriptor(script, provider)->ToString();
                needles.emplace(script);
                descriptors.emplace(std::move(script), std::move(inferred));
            }
        }

        // Scan the unspent transaction output set for inputs
        UniValue unspents(UniValue::VARR);
        std::vector<CTxOut> input_txos;
        std::map<COutPoint, Coin> coins;
        g_should_abort_scan = false;
        int64_t count = 0;
        std::unique_ptr<CCoinsViewCursor> pcursor;
        const CBlockIndex* tip;
        NodeContext& node = EnsureAnyNodeContext(request.context);
        {
            ChainstateManager& chainman = EnsureChainman(node);
            LOCK(cs_main);
            Chainstate& active_chainstate = chainman.ActiveChainstate();
            active_chainstate.ForceFlushStateToDisk();
            pcursor = CHECK_NONFATAL(active_chainstate.CoinsDB().Cursor());
            tip = CHECK_NONFATAL(active_chainstate.m_chain.Tip());
        }
        bool res = FindScriptPubKey(g_scan_progress, g_should_abort_scan, count, pcursor.get(), needles, coins, node.rpc_interruption_point);
        result.pushKV("success", res);
        result.pushKV("txouts", count);
        result.pushKV("height", tip->nHeight);
        result.pushKV("bestblock", tip->GetBlockHash().GetHex());

        for (const auto& it : coins) {
            const COutPoint& outpoint = it.first;
            const Coin& coin = it.second;
            const CTxOut& txo = coin.out;
            const CBlockIndex& coinb_block{*CHECK_NONFATAL(tip->GetAncestor(coin.nHeight))};
            input_txos.push_back(txo);
            total_in += txo.nValue;

            UniValue unspent(UniValue::VOBJ);
            unspent.pushKV("txid", outpoint.hash.GetHex());
            unspent.pushKV("vout", outpoint.n);
            unspent.pushKV("scriptPubKey", HexStr(txo.scriptPubKey));
            unspent.pushKV("desc", descriptors[txo.scriptPubKey]);
            unspent.pushKV("amount", ValueFromAmount(txo.nValue));
            unspent.pushKV("coinbase", coin.IsCoinBase());
            unspent.pushKV("height", coin.nHeight);
            unspent.pushKV("blockhash", coinb_block.GetBlockHash().GetHex());
            unspent.pushKV("confirmations", tip->nHeight - coin.nHeight + 1);

            unspents.push_back(std::move(unspent));
        }
        result.pushKV("unspents", std::move(unspents));
        result.pushKV("total_amount", ValueFromAmount(total_in));
    } else {
        throw JSONRPCError(RPC_INVALID_PARAMETER, strprintf("Invalid action '%s'", action));
    }
    return result;
},
    };
}